

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::SCAtomTypesSectionParser::parseLine
          (SCAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  AtomType *AT;
  undefined8 uVar2;
  uint in_ECX;
  RealType RVar3;
  RealType m_00;
  RealType n_00;
  RealType alpha_00;
  RealType RVar4;
  RealType RVar5;
  double c_00;
  RealType alpha;
  RealType n;
  RealType m;
  RealType c;
  RealType epsilon;
  SuttonChenAdapter sca;
  AtomType *atomType;
  string atomTypeName;
  int nTokens;
  StringTokenizer tokenizer;
  StringTokenizer *in_stack_fffffffffffffe90;
  StringTokenizer *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  ForceField *in_stack_fffffffffffffed0;
  errorStruct *peVar6;
  SuttonChenAdapter in_stack_ffffffffffffff20;
  string local_d0 [8];
  StringTokenizer *in_stack_ffffffffffffff38;
  allocator<char> local_99;
  string local_98 [124];
  uint local_1c;
  
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
             (allocator<char> *)in_stack_fffffffffffffec0);
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             in_stack_fffffffffffffec0);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  iVar1 = StringTokenizer::countTokens(in_stack_fffffffffffffea0);
  if (iVar1 < 6) {
    peVar6 = &painCave;
    snprintf(painCave.errMsg,2000,"SCAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)local_1c);
    peVar6->isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff38);
    AT = ForceField::getAtomType(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    if (AT == (AtomType *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,
               "SCAtomTypesSectionParser Error: Atom Type [%s] is not created yet\n",uVar2);
      painCave.isFatal = 1;
      simError();
    }
    else {
      SuttonChenAdapter::SuttonChenAdapter((SuttonChenAdapter *)&stack0xffffffffffffff20,AT);
      RVar3 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffed0);
      m_00 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffed0);
      n_00 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffed0);
      alpha_00 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffed0);
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffed0);
      RVar5 = ForceFieldOptions::getMetallicEnergyUnitScaling((ForceFieldOptions *)0x2d8e34);
      c_00 = RVar3 * RVar5;
      in_stack_fffffffffffffe90 =
           (StringTokenizer *)
           ForceFieldOptions::getDistanceUnitScaling((ForceFieldOptions *)0x2d8e66);
      SuttonChenAdapter::makeSuttonChen
                ((SuttonChenAdapter *)in_stack_ffffffffffffff20.at_,c_00,m_00,n_00,alpha_00,
                 RVar4 * (double)in_stack_fffffffffffffe90);
    }
    std::__cxx11::string::~string(local_d0);
  }
  StringTokenizer::~StringTokenizer(in_stack_fffffffffffffe90);
  return;
}

Assistant:

void SCAtomTypesSectionParser::parseLine(ForceField& ff,
                                           const std::string& line,
                                           int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in SCAtomTypesSectionParser, a line at least contains 6 tokens
    // atomTypeName, epsilon,c,m,n and alpha
    if (nTokens < 6) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SCAtomTypesSectionParser Error: Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      std::string atomTypeName = tokenizer.nextToken();
      AtomType* atomType       = ff.getAtomType(atomTypeName);

      if (atomType != NULL) {
        SuttonChenAdapter sca = SuttonChenAdapter(atomType);

        RealType epsilon = tokenizer.nextTokenAsDouble();
        RealType c       = tokenizer.nextTokenAsDouble();
        RealType m       = tokenizer.nextTokenAsDouble();
        RealType n       = tokenizer.nextTokenAsDouble();
        RealType alpha   = tokenizer.nextTokenAsDouble();

        epsilon *= options_.getMetallicEnergyUnitScaling();
        alpha *= options_.getDistanceUnitScaling();

        sca.makeSuttonChen(c, m, n, alpha, epsilon);

      } else {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "SCAtomTypesSectionParser Error: Atom Type [%s] is not created "
            "yet\n",
            atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }